

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# C++20Support.hpp
# Opt level: O0

string * std::format<std::__cxx11::string&,std::__cxx11::string>
                   (string_view fmt,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_1)

{
  basic_string_view<char,_std::char_traits<char>_> __str;
  basic_string_view<char,_std::char_traits<char>_> __str_00;
  basic_string_view<char,_std::char_traits<char>_> __str_01;
  char *pcVar1;
  ulong uVar2;
  const_iterator pvVar3;
  reference pvVar4;
  size_type sVar5;
  char *pcVar6;
  basic_ostream<char,_std::char_traits<char>_> *pbVar7;
  basic_ostream<char,_std::char_traits<char>_> *pbVar8;
  const_iterator pvVar9;
  string *in_RCX;
  string *in_RDI;
  string *in_R8;
  stringstream ss;
  const_iterator frag;
  const_iterator parser;
  const_iterator start;
  size_t index;
  array<std::basic_string_view<char,_std::char_traits<char>_>,_32UL> fragments;
  size_type in_stack_fffffffffffffb48;
  basic_ostream<char,_std::char_traits<char>_> *in_stack_fffffffffffffb50;
  const_iterator __os;
  size_t in_stack_fffffffffffffb58;
  char *in_stack_fffffffffffffb60;
  basic_string_view<char,_std::char_traits<char>_> *local_450;
  stringstream local_400 [392];
  const_iterator local_278;
  basic_string_view<char,_std::char_traits<char>_> local_270;
  basic_string_view<char,_std::char_traits<char>_> local_260;
  basic_string_view<char,_std::char_traits<char>_> local_250;
  char *local_240;
  char *local_238;
  ulong local_230;
  array<std::basic_string_view<char,_std::char_traits<char>_>,_32UL> local_228;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  basic_string_view<char,_std::char_traits<char>_> local_18;
  
  local_28._M_len = (size_t)in_R8;
  local_28._M_str = (char *)in_RCX;
  memset(&local_228,0,0x200);
  local_450 = local_228._M_elems;
  do {
    webfront::http::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (local_450);
    local_450 = local_450 + 1;
  } while (local_450 != &local_28);
  local_230 = 0;
  local_240 = webfront::http::std::basic_string_view<char,_std::char_traits<char>_>::cbegin
                        (&local_18);
  local_238 = local_240;
  for (; pcVar6 = local_240,
      pvVar3 = webfront::http::std::basic_string_view<char,_std::char_traits<char>_>::cend
                         (&local_18), pcVar1 = local_238, pcVar6 != pvVar3;
      local_240 = local_240 + 1) {
    if (*local_240 == '{') {
      pvVar3 = webfront::http::std::basic_string_view<char,_std::char_traits<char>_>::cbegin
                         (&local_18);
      uVar2 = local_230;
      if (pcVar1 == pvVar3) {
        webfront::http::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_250,local_238,(long)local_240 - (long)local_238);
        local_230 = local_230 + 1;
        pvVar4 = webfront::http::std::
                 array<std::basic_string_view<char,_std::char_traits<char>_>,_32UL>::operator[]
                           ((array<std::basic_string_view<char,_std::char_traits<char>_>,_32UL> *)
                            in_stack_fffffffffffffb50,in_stack_fffffffffffffb48);
        pvVar4->_M_len = local_250._M_len;
        pvVar4->_M_str = local_250._M_str;
      }
      else if ((local_238 != local_240) &&
              (sVar5 = webfront::http::std::
                       array<std::basic_string_view<char,_std::char_traits<char>_>,_32UL>::size
                                 (&local_228), uVar2 < sVar5)) {
        webfront::http::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_260,local_238 + 1,(long)local_240 - (long)(local_238 + 1));
        local_230 = local_230 + 1;
        pvVar4 = webfront::http::std::
                 array<std::basic_string_view<char,_std::char_traits<char>_>,_32UL>::operator[]
                           ((array<std::basic_string_view<char,_std::char_traits<char>_>,_32UL> *)
                            in_stack_fffffffffffffb50,in_stack_fffffffffffffb48);
        pvVar4->_M_len = local_260._M_len;
        pvVar4->_M_str = local_260._M_str;
      }
    }
    else if (*local_240 == '}') {
      local_238 = local_240;
    }
  }
  pcVar6 = local_238 + 1;
  pvVar3 = webfront::http::std::basic_string_view<char,_std::char_traits<char>_>::cend(&local_18);
  if (pcVar6 != pvVar3) {
    pcVar6 = local_238 + 1;
    pvVar3 = webfront::http::std::basic_string_view<char,_std::char_traits<char>_>::cend(&local_18);
    webfront::http::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_270,pcVar6,(long)pvVar3 - (long)(local_238 + 1));
    local_230 = local_230 + 1;
    pvVar4 = webfront::http::std::array<std::basic_string_view<char,_std::char_traits<char>_>,_32UL>
             ::operator[]((array<std::basic_string_view<char,_std::char_traits<char>_>,_32UL> *)
                          in_stack_fffffffffffffb50,in_stack_fffffffffffffb48);
    pvVar4->_M_len = local_270._M_len;
    pvVar4->_M_str = local_270._M_str;
  }
  local_278 = webfront::http::std::
              array<std::basic_string_view<char,_std::char_traits<char>_>,_32UL>::cbegin
                        ((array<std::basic_string_view<char,_std::char_traits<char>_>,_32UL> *)
                         0x11482e);
  std::__cxx11::stringstream::stringstream(local_400);
  local_278 = local_278 + 1;
  __str._M_str = in_stack_fffffffffffffb60;
  __str._M_len = in_stack_fffffffffffffb58;
  pbVar7 = operator<<(in_stack_fffffffffffffb50,__str);
  std::operator<<(pbVar7,(string *)local_28._M_str);
  local_278 = local_278 + 1;
  __str_00._M_str = (char *)pbVar7;
  __str_00._M_len = in_stack_fffffffffffffb58;
  pbVar8 = operator<<(in_stack_fffffffffffffb50,__str_00);
  std::operator<<(pbVar8,(string *)local_28._M_len);
  while (__os = local_278,
        pvVar9 = webfront::http::std::
                 array<std::basic_string_view<char,_std::char_traits<char>_>,_32UL>::cend
                           ((array<std::basic_string_view<char,_std::char_traits<char>_>,_32UL> *)
                            0x114913), __os != pvVar9) {
    local_278 = local_278 + 1;
    __str_01._M_str = (char *)pbVar7;
    __str_01._M_len = (size_t)pbVar8;
    operator<<((basic_ostream<char,_std::char_traits<char>_> *)__os,__str_01);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_400);
  return in_RDI;
}

Assistant:

string format(std::string_view fmt, auto&&... ts) {
    if (sizeof...(ts) == 0) return std::string(fmt);
    std::array<std::string_view, 32> fragments{};
    if (sizeof...(ts) > fragments.size()) throw std::length_error("format parameters count limit exceeded");
    size_t index = 0;
    auto start = fmt.cbegin(), parser = start;
    while (parser != fmt.cend()) {
        if (*parser == '{') {
            if (start == fmt.cbegin())
                fragments[index++] = std::string_view(start, static_cast<size_t>(parser - start));          /// string_view constructor with iterators is missing in Apple Clang 13
            else if (start != parser && index < fragments.size())
                fragments[index++] = std::string_view(start + 1, static_cast<size_t>(parser - (start + 1)));/// string_view constructor with iterators is missing in Apple Clang 13
        }
        else if (*parser == '}')
            start = parser;
        ++parser;
    }
    if (start + 1 != fmt.cend()) fragments[index++] = std::string_view(start + 1, static_cast<size_t>(fmt.cend() - (start + 1)));/// string_view constructor with iterators is missing in Apple Clang 13

    auto frag = fragments.cbegin();
    stringstream ss;
    using webfront::operator<<;
    ((ss << *frag++ << std::forward<decltype(ts)>(ts)), ...);
    while (frag != fragments.cend()) ss << *frag++;
    return ss.str();
}